

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<char,unsigned_long>(void)

{
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs
  ;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> i;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_00;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_01;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  bits;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  bits_00;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_02;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_03;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs_04;
  unsigned_long u2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  char t;
  unsigned_long u;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffdf8;
  undefined5 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe05;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe06;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe07;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe08;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar1;
  undefined6 in_stack_fffffffffffffe10;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe16;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe17;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe18;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffe28;
  char local_19;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_b;
  byte local_a;
  char local_9;
  unsigned_long local_8;
  
  local_8 = 0;
  local_9 = 0;
  local_a = 0;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             &in_stack_fffffffffffffdf8->m_int);
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_18,&local_8);
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int);
  local_a = (local_a ^ 0xff) & 1;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (char *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (unsigned_long *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             in_stack_fffffffffffffdf8);
  local_b.m_int = local_19;
  SafeInt::operator_cast_to_unsigned_long
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator*((unsigned_long)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  SVar1.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  SVar1.m_int._0_6_ = in_stack_fffffffffffffe10;
  SVar1.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,SVar1);
  local_8 = 1;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                        CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
            (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  rhs.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,rhs);
  local_8 = 1;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator/(in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  i.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  i.m_int._0_6_ = in_stack_fffffffffffffe10;
  i.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,i);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator+((unsigned_long)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  rhs_00.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_00.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_00.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,rhs_00);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  local_8 = 0;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator-((unsigned_long)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                         CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
             (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                        CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
            (int *)in_stack_fffffffffffffe08.m_int);
  rhs_01.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_01.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_01.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,rhs_01);
  local_8 = 1;
  SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT17(in_stack_fffffffffffffe17.m_int,
                        CONCAT16(in_stack_fffffffffffffe16.m_int,in_stack_fffffffffffffe10)),
            (int *)in_stack_fffffffffffffe08.m_int);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe27,
                         CONCAT16(in_stack_fffffffffffffe26,
                                  CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
             in_stack_fffffffffffffe28);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator<<(in_stack_fffffffffffffe17.m_int,in_stack_fffffffffffffe18);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  bits.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  bits.m_int._0_6_ = in_stack_fffffffffffffe10;
  bits.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,bits);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe27,
                         CONCAT16(in_stack_fffffffffffffe26,
                                  CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
             in_stack_fffffffffffffe28);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator>>(in_stack_fffffffffffffe17.m_int,in_stack_fffffffffffffe18);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  bits_00.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  bits_00.m_int._0_6_ = in_stack_fffffffffffffe10;
  bits_00.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,bits_00);
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe16);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator&(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe17);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  rhs_02.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_02.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_02.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,rhs_02);
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator|(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe17);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  rhs_03.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_03.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_03.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,rhs_03);
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe06);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,
             CONCAT17(in_stack_fffffffffffffe07.m_int,
                      CONCAT16(in_stack_fffffffffffffe06.m_int,
                               CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))));
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  operator^(in_stack_fffffffffffffe07.m_int,in_stack_fffffffffffffe08);
  local_9 = SafeInt::operator_cast_to_char
                      ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                                   CONCAT16(in_stack_fffffffffffffe06.m_int,
                                            CONCAT15(in_stack_fffffffffffffe05,
                                                     in_stack_fffffffffffffe00))));
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe17);
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffe07.m_int,
                         CONCAT16(in_stack_fffffffffffffe06.m_int,
                                  CONCAT15(in_stack_fffffffffffffe05,in_stack_fffffffffffffe00))),
             (unsigned_long)in_stack_fffffffffffffdf8);
  rhs_04.m_int._6_1_ = in_stack_fffffffffffffe16.m_int;
  rhs_04.m_int._0_6_ = in_stack_fffffffffffffe10;
  rhs_04.m_int._7_1_ = in_stack_fffffffffffffe17.m_int;
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffe08.m_int,rhs_04);
  local_a = operator<(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator<(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08.m_int);
  local_a = operator<((unsigned_long)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe07);
  local_a = operator<(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator<=(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator<=(in_stack_fffffffffffffe07,(unsigned_long)in_stack_fffffffffffffdf8);
  local_a = operator<=(in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe17);
  local_a = operator<=(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator>(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator>(in_stack_fffffffffffffe07,(unsigned_long)in_stack_fffffffffffffdf8);
  local_a = operator>(in_stack_fffffffffffffe08.m_int,in_stack_fffffffffffffe17);
  local_a = operator>(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator>=(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  local_a = operator>=(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08.m_int);
  local_a = operator>=((unsigned_long)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe07);
  local_a = operator>=(in_stack_fffffffffffffe17,in_stack_fffffffffffffe08);
  SVar1.m_int = local_18.m_int;
  lhs.m_int = local_b.m_int;
  local_a = operator==(local_b,local_18);
  local_a = operator==(local_b,(unsigned_long)in_stack_fffffffffffffdf8);
  local_a = operator==((unsigned_long)in_stack_fffffffffffffdf8,local_b);
  operator==(lhs,SVar1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}